

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_slots.cpp
# Opt level: O3

void Am_Register_Slot_Key(Am_Slot_Key key,char *string)

{
  _Rb_tree_header *p_Var1;
  Am_Symbol_Table *pAVar2;
  Am_Symbol_Table *pAVar3;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  _Base_ptr *pp_Var6;
  uint *puVar7;
  mapped_type *ppcVar8;
  _Base_ptr p_Var9;
  uint uVar10;
  char *pcVar11;
  ostream *poVar12;
  char *local_28;
  
  if (Am_Slot_Name_Key_Table == (Am_Symbol_Table *)0x0) {
    Am_Slot_Name_Key_Table = Am_Symbol_Table::Create(500);
  }
  pAVar2 = Am_Slot_Name_Key_Table;
  local_28 = string;
  cVar4 = std::
          _Rb_tree<const_char_*,_std::pair<const_char_*const,_int>,_std::_Select1st<std::pair<const_char_*const,_int>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
          ::find((_Rb_tree<const_char_*,_std::pair<const_char_*const,_int>,_std::_Select1st<std::pair<const_char_*const,_int>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                  *)Am_Slot_Name_Key_Table,&local_28);
  pAVar3 = Am_Slot_Name_Key_Table;
  pp_Var6 = (_Base_ptr *)&(pAVar2->Am_Map_CStr2Int).mDefaultReturn;
  if ((_Rb_tree_header *)cVar4._M_node !=
      &(pAVar2->Am_Map_CStr2Int).mMap._M_t._M_impl.super__Rb_tree_header) {
    pp_Var6 = &cVar4._M_node[1]._M_parent;
  }
  if (*(int *)pp_Var6 != -1) {
    poVar12 = std::operator<<((ostream *)&std::cerr,"Slot Name, ");
    poVar12 = std::operator<<(poVar12,string);
    pcVar11 = ", has been overwritten.";
    goto LAB_00229eb7;
  }
  p_Var9 = (Am_Slot_Name_Key_Table->Am_Map_CInt2Str).mMap._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_parent;
  uVar10 = (uint)key;
  if (p_Var9 == (_Base_ptr)0x0) {
LAB_00229e1d:
    pp_Var6 = (_Base_ptr *)&(Am_Slot_Name_Key_Table->Am_Map_CInt2Str).mDefaultReturn;
  }
  else {
    p_Var1 = &(Am_Slot_Name_Key_Table->Am_Map_CInt2Str).mMap._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if ((int)(uint)key <= (int)p_Var9[1]._M_color) {
        p_Var5 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < (int)(uint)key];
    } while (p_Var9 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 == p_Var1) || ((int)uVar10 < (int)p_Var5[1]._M_color))
    goto LAB_00229e1d;
    pp_Var6 = &p_Var5[1]._M_parent;
  }
  if (*pp_Var6 == (_Base_ptr)0x0) {
    local_28 = string;
    puVar7 = (uint *)std::
                     map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                     ::operator[]((map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                                   *)Am_Slot_Name_Key_Table,&local_28);
    *puVar7 = uVar10;
    local_28 = (char *)CONCAT44(local_28._4_4_,uVar10);
    ppcVar8 = std::
              map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
              ::operator[](&(pAVar3->Am_Map_CInt2Str).mMap,(key_type *)&local_28);
    *ppcVar8 = string;
    return;
  }
  std::operator<<((ostream *)&std::cerr,"Slot Key, ");
  Am_Print_Key((ostream *)&std::cerr,key);
  pcVar11 = ", has already been used.";
  poVar12 = (ostream *)&std::cerr;
LAB_00229eb7:
  poVar12 = std::operator<<(poVar12,pcVar11);
  std::endl<char,std::char_traits<char>>(poVar12);
  Am_Error();
}

Assistant:

void
Am_Register_Slot_Key(Am_Slot_Key key, const char *string)
{
  verify_slot_name_key_table();
  int prev_key = Am_Slot_Name_Key_Table->Get_Value(string);
  if (prev_key != -1) {
    std::cerr << "Slot Name, " << string << ", has been overwritten."
              << std::endl;
    Am_Error();
  }
  const char *prev_name = Am_Slot_Name_Key_Table->Get_Key(key);
  if (prev_name) {
    std::cerr << "Slot Key, ";
    Am_Print_Key(std::cerr, key);
    std::cerr << ", has already been used." << std::endl;
    Am_Error();
  }
  Am_Slot_Name_Key_Table->Add_Item(key, string);
}